

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O2

void Saig_ManFilterUsingInd(Aig_Man_t *p,Vec_Vec_t *vCands,int nConfs,int nProps,int fVerbose)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  Cnf_Dat_t *p_01;
  sat_solver *s;
  Aig_Man_t *p_02;
  void *Entry;
  char *pcVar3;
  uint i;
  Aig_Man_t *p_03;
  int in_R9D;
  int iVar4;
  int i_00;
  
  p_00 = Saig_ManCreateIndMiter(p,vCands);
  iVar4 = p_00->nObjs[3];
  iVar1 = Vec_VecSizeSize(vCands);
  if (iVar4 != iVar1) {
    __assert_fail("Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigConstr2.c"
                  ,0x166,"void Saig_ManFilterUsingInd(Aig_Man_t *, Vec_Vec_t *, int, int, int)");
  }
  p_01 = Cnf_DeriveSimple(p_00,p_00->nObjs[3]);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  if (fVerbose != 0) {
    printf("Filtered cands:  ");
  }
  iVar4 = 0;
  for (i = 0; (int)i < vCands->nSize; i = i + 1) {
    p_02 = (Aig_Man_t *)Vec_VecEntry(vCands,i);
    iVar1 = 0;
    for (i_00 = 0; i_00 < *(int *)((long)&p_02->pName + 4); i_00 = i_00 + 1) {
      p_03 = p_02;
      Entry = Vec_PtrEntry((Vec_Ptr_t *)p_02,i_00);
      iVar2 = Saig_ManFilterUsingIndOne_new(p_03,p_00,s,p_01,nConfs,in_R9D,iVar4 + i_00);
      if (iVar2 != 0) {
        iVar2 = iVar1 + 1;
        Vec_PtrWriteEntry((Vec_Ptr_t *)p_02,iVar1,Entry);
        iVar1 = iVar2;
        if (fVerbose != 0) {
          pcVar3 = "!";
          if (((ulong)Entry & 1) == 0) {
            pcVar3 = "";
          }
          printf("%d:%s%d  ",(ulong)i,pcVar3,
                 (ulong)*(uint *)(((ulong)Entry & 0xfffffffffffffffe) + 0x24));
        }
      }
    }
    Vec_PtrShrink((Vec_Ptr_t *)p_02,iVar1);
    iVar4 = iVar4 + i_00;
  }
  if (fVerbose == 0) {
    Cnf_DataFree(p_01);
    sat_solver_delete(s);
  }
  else {
    putchar(10);
    Cnf_DataFree(p_01);
    sat_solver_delete(s);
    Aig_ManPrintStats(p_00);
  }
  Aig_ManStop(p_00);
  return;
}

Assistant:

void Saig_ManFilterUsingInd( Aig_Man_t * p, Vec_Vec_t * vCands, int nConfs, int nProps, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pFrames;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int i, k, k2, Counter;
/*
    Vec_VecForEachLevel( vCands, vNodes, i )
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
            printf( "%d ", Aig_ObjId(Aig_Regular(pObj)) );
    printf( "\n" );
*/
    // create timeframes
//    pFrames = Saig_ManUnrollInd( p );
    pFrames = Saig_ManCreateIndMiter( p, vCands );
    assert( Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands) );
    // start the SAT solver
    pCnf = Cnf_DeriveSimple( pFrames, Aig_ManCoNum(pFrames) );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    // check candidates
    if ( fVerbose )
        printf( "Filtered cands:  " );
    Counter = 0;
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        k2 = 0;
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            if ( Saig_ManFilterUsingIndOne_new( p, pFrames, pSat, pCnf, nConfs, nProps, Counter++ ) )
//            if ( Saig_ManFilterUsingIndOne_old( p, pSat, pCnf, nConfs, pObj ) )
            {
                Vec_PtrWriteEntry( vNodes, k2++, pObj );
                if ( fVerbose )
                    printf( "%d:%s%d  ", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
            }
        }
        Vec_PtrShrink( vNodes, k2 );
    }
    if ( fVerbose )
        printf( "\n" );
    // clean up
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    if ( fVerbose )
        Aig_ManPrintStats( pFrames );
    Aig_ManStop( pFrames );
}